

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O0

int pystring::anon_unknown_2::_string_tailmatch
              (string *self,string *substr,Py_ssize_t start,Py_ssize_t end,int direction)

{
  int iVar1;
  int iVar2;
  void *__s2;
  long lVar3;
  char *str;
  char *sub;
  Py_ssize_t slen;
  Py_ssize_t len;
  int direction_local;
  Py_ssize_t end_local;
  Py_ssize_t start_local;
  string *substr_local;
  string *self_local;
  
  iVar1 = std::__cxx11::string::size();
  iVar2 = std::__cxx11::string::size();
  __s2 = (void *)std::__cxx11::string::c_str();
  lVar3 = std::__cxx11::string::c_str();
  len = iVar1;
  if (((end <= iVar1) && (len = end, end < 0)) && (len = iVar1 + end, iVar1 + end < 0)) {
    len = 0;
  }
  direction_local = start;
  if ((start < 0) && (direction_local = iVar1 + start, direction_local < 0)) {
    direction_local = 0;
  }
  if (direction < 0) {
    if (iVar1 < direction_local + iVar2) {
      return 0;
    }
  }
  else {
    if ((len - direction_local < iVar2) || (iVar1 < direction_local)) {
      return 0;
    }
    if (direction_local < len - iVar2) {
      direction_local = len - iVar2;
    }
  }
  if (len - direction_local < iVar2) {
    self_local._4_4_ = 0;
  }
  else {
    iVar1 = memcmp((void *)(lVar3 + direction_local),__s2,(long)iVar2);
    self_local._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  }
  return self_local._4_4_;
}

Assistant:

int _string_tailmatch(const std::string & self, const std::string & substr,
                              Py_ssize_t start, Py_ssize_t end,
                              int direction)
        {
            Py_ssize_t len = (Py_ssize_t) self.size();
            Py_ssize_t slen = (Py_ssize_t) substr.size();
            
            const char* sub = substr.c_str();
            const char* str = self.c_str();
            
            ADJUST_INDICES(start, end, len);
            
            if (direction < 0) {
                // startswith
                if (start+slen > len)
                    return 0;
            } else {
                // endswith
                if (end-start < slen || start > len)
                    return 0;
                if (end-slen > start)
                    start = end - slen;
            }
            if (end-start >= slen)
                return (!std::memcmp(str+start, sub, slen));
            
            return 0;
        }